

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_input_motion(nk_context *ctx,int x,int y)

{
  if (ctx != (nk_context *)0x0) {
    (ctx->input).mouse.pos.x = (float)x;
    (ctx->input).mouse.pos.y = (float)y;
    (ctx->input).mouse.delta.x = (float)x - (ctx->input).mouse.prev.x;
    (ctx->input).mouse.delta.y = (float)y - (ctx->input).mouse.prev.y;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x369d,"void nk_input_motion(struct nk_context *, int, int)");
}

Assistant:

NK_API void
nk_input_motion(struct nk_context *ctx, int x, int y)
{
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    in->mouse.pos.x = (float)x;
    in->mouse.pos.y = (float)y;
    in->mouse.delta.x = in->mouse.pos.x - in->mouse.prev.x;
    in->mouse.delta.y = in->mouse.pos.y - in->mouse.prev.y;
}